

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O2

void __thiscall xe::ri::Number::~Number(Number *this)

{
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__Number_001275b0;
  std::__cxx11::string::~string((string *)&this->tag);
  std::__cxx11::string::~string((string *)&this->unit);
  std::__cxx11::string::~string((string *)&this->description);
  std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

~Number			(void) {}